

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3PagerExclusiveLock(Pager *pPager)

{
  int iVar1;
  
  iVar1 = 0;
  if (pPager->pWal == (Wal *)0x0) {
    do {
      if ((3 < pPager->eLock) && (pPager->eLock != 5)) {
        return 0;
      }
      iVar1 = (*pPager->fd->pMethods->xLock)(pPager->fd,4);
      if (iVar1 != 5) {
        if (iVar1 != 0) {
          return iVar1;
        }
        pPager->eLock = '\x04';
        return 0;
      }
      iVar1 = (*pPager->xBusyHandler)(pPager->pBusyHandlerArg);
    } while (iVar1 != 0);
    iVar1 = 5;
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerExclusiveLock(Pager *pPager){
  int rc = SQLITE_OK;
  assert( pPager->eState==PAGER_WRITER_CACHEMOD 
       || pPager->eState==PAGER_WRITER_DBMOD 
       || pPager->eState==PAGER_WRITER_LOCKED 
  );
  assert( assert_pager_state(pPager) );
  if( 0==pagerUseWal(pPager) ){
    rc = pager_wait_on_lock(pPager, EXCLUSIVE_LOCK);
  }
  return rc;
}